

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

QWidget * __thiscall QFormLayout::labelForField(QFormLayout *this,QLayout *field)

{
  long lVar1;
  QFormLayoutItem **ppQVar2;
  QWidget *pQVar3;
  ItemRole *in_RSI;
  FixedColumnMatrix<QFormLayoutItem_*,_2> *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutItem *label;
  QFormLayoutPrivate *d;
  ItemRole role;
  int row;
  undefined8 in_stack_ffffffffffffffb8;
  FixedColumnMatrix<QFormLayoutItem_*,_2> *rowPtr;
  QLayout *in_stack_ffffffffffffffe8;
  int iVar4;
  int iVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rowPtr = in_RDI;
  d_func((QFormLayout *)0x4b810f);
  iVar5 = -0x55555556;
  iVar4 = -0x55555556;
  getLayoutPosition((QFormLayout *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffe8,(int *)rowPtr,
                    in_RSI);
  if (((iVar5 == -1) || (iVar4 != 1)) ||
     (ppQVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                          (in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (int)in_stack_ffffffffffffffb8), *ppQVar2 == (QFormLayoutItem *)0x0)) {
    pQVar3 = (QWidget *)0x0;
  }
  else {
    pQVar3 = QFormLayoutItem::widget((QFormLayoutItem *)0x4b817c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QWidget *QFormLayout::labelForField(QLayout *field) const
{
    Q_D(const QFormLayout);

    int row;
    ItemRole role;

    getLayoutPosition(field, &row, &role);

    if (row != -1 && role == FieldRole) {
        if (QFormLayoutItem *label = d->m_matrix(row, LabelRole))
            return label->widget();
    }
    return nullptr;
}